

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcBeamType::~IfcBeamType(IfcBeamType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  
  this_00 = (IfcTypeProduct *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
  pvVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).field_0x20 +
           *(long *)(*(long *)this + -0x18);
  *(undefined8 *)((long)pvVar1 + -0x1b0) = 0x9c3ca8;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x9c3dc0;
  *(undefined8 *)((long)pvVar1 + -0x128) = 0x9c3cd0;
  *(undefined8 *)((long)pvVar1 + -0x118) = 0x9c3cf8;
  *(undefined8 *)((long)pvVar1 + -0xc0) = 0x9c3d20;
  *(undefined8 *)((long)pvVar1 + -0x68) = 0x9c3d48;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x9c3d70;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x9c3d98;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x9c4088;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x60 = 0x9c4150;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x9c40b0;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x9c40d8;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x9c4100;
  *(undefined8 *)&this_00->field_0x148 = 0x9c4128;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__009c3de8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcBeamType() : Object("IfcBeamType") {}